

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_is_empty(void **param_1)

{
  roaring64_bitmap_t *b;
  char *in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  int in_stack_ffffffffffffffec;
  
  b = roaring64_bitmap_create();
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_is_empty((roaring64_bitmap_t *)0x105867);
  _assert_true((unsigned_long)unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_add(unaff_retaddr,(uint64_t)in_RDI);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_is_empty((roaring64_bitmap_t *)0x1058a9);
  _assert_true((unsigned_long)unaff_retaddr,in_RDI,(char *)b,in_stack_ffffffffffffffec);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_is_empty) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    assert_r64_valid(r);
    assert_true(roaring64_bitmap_is_empty(r));
    roaring64_bitmap_add(r, 1);
    assert_r64_valid(r);
    assert_false(roaring64_bitmap_is_empty(r));
    roaring64_bitmap_free(r);
}